

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyz.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAxyz::ArchiveIN(ChNodeFEAxyz *this)

{
  ChArchiveIn *in_RSI;
  
  ArchiveIN((ChNodeFEAxyz *)
            ((long)&(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase +
            (long)(this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase[-0x18]),in_RSI);
  return;
}

Assistant:

void ChNodeFEAxyz::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChNodeFEAxyz>();
    // deserialize parent class
    ChNodeFEAbase::ArchiveIN(marchive);
    // serialize parent class
    ChNodeXYZ::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(X0);
    marchive >> CHNVP(Force);
}